

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.c
# Opt level: O2

int uv__socket(int domain,int type,int protocol)

{
  int fd;
  int iVar1;
  int *piVar2;
  
  fd = socket(domain,type | 0x80800,protocol);
  if (fd == -1) {
    piVar2 = __errno_location();
    if (*piVar2 == 0x16) {
      fd = socket(domain,type,protocol);
      if (fd == -1) {
        fd = -*piVar2;
      }
      else {
        iVar1 = uv__nonblock_ioctl(fd,1);
        if (iVar1 == 0) {
          iVar1 = uv__cloexec_ioctl(fd,1);
        }
        if (iVar1 != 0) {
          uv__close(fd);
          fd = iVar1;
        }
      }
    }
    else {
      fd = -*piVar2;
    }
  }
  return fd;
}

Assistant:

int uv__socket(int domain, int type, int protocol) {
  int sockfd;
  int err;

#if defined(SOCK_NONBLOCK) && defined(SOCK_CLOEXEC)
  sockfd = socket(domain, type | SOCK_NONBLOCK | SOCK_CLOEXEC, protocol);
  if (sockfd != -1)
    return sockfd;

  if (errno != EINVAL)
    return -errno;
#endif

  sockfd = socket(domain, type, protocol);
  if (sockfd == -1)
    return -errno;

  err = uv__nonblock(sockfd, 1);
  if (err == 0)
    err = uv__cloexec(sockfd, 1);

  if (err) {
    uv__close(sockfd);
    return err;
  }

#if defined(SO_NOSIGPIPE)
  {
    int on = 1;
    setsockopt(sockfd, SOL_SOCKET, SO_NOSIGPIPE, &on, sizeof(on));
  }
#endif

  return sockfd;
}